

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

bool __thiscall t_rs_generator::is_double(t_rs_generator *this,t_type *ttype)

{
  uint uVar1;
  t_base tVar2;
  t_base_type *this_00;
  t_base tbase;
  t_type *ttype_local;
  t_rs_generator *this_local;
  
  this_00 = (t_base_type *)t_generator::get_true_type(ttype);
  uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if (((uVar1 & 1) == 0) || (tVar2 = t_base_type::get_base(this_00), tVar2 != TYPE_DOUBLE)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool t_rs_generator::is_double(t_type* ttype) {
  ttype = get_true_type(ttype);
  if (ttype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
    if (tbase == t_base_type::TYPE_DOUBLE) {
      return true;
    }
  }

  return false;
}